

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::upgradewallet(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff488;
  vector<RPCResult,_std::allocator<RPCResult>_> *this;
  allocator<RPCResult> *this_00;
  RPCArg *this_01;
  UniValue *in_stack_fffffffffffff490;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4c0;
  UniValue *in_stack_fffffffffffff4c8;
  char *in_stack_fffffffffffff4d0;
  undefined7 in_stack_fffffffffffff4d8;
  undefined1 in_stack_fffffffffffff4df;
  string *in_stack_fffffffffffff4e0;
  undefined7 in_stack_fffffffffffff4e8;
  undefined1 in_stack_fffffffffffff4ef;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff4f0;
  string *in_stack_fffffffffffff4f8;
  undefined1 *puVar2;
  RPCArg *in_stack_fffffffffffff500;
  RPCResult *in_stack_fffffffffffff508;
  RPCResult *in_stack_fffffffffffff510;
  undefined1 *local_ae8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_02;
  allocator<char> local_94d;
  allocator<char> local_94c;
  allocator<char> local_94b;
  allocator<char> local_94a [2];
  pointer local_948;
  pointer pRStack_940;
  pointer local_938;
  allocator<char> local_92a;
  allocator<char> local_929 [25];
  undefined8 in_stack_fffffffffffff6f0;
  allocator<char> local_8ea;
  allocator<char> local_8e9 [17];
  undefined8 local_8d8;
  allocator<char> local_8ca;
  allocator<char> local_8c9;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [14];
  undefined1 local_8aa;
  vector<RPCArg,_std::allocator<RPCArg>_> local_8a9;
  undefined1 local_88a;
  undefined1 local_889 [32];
  allocator<char> local_869;
  undefined4 local_868;
  allocator<char> local_861 [31];
  allocator<char> local_842;
  allocator<char> local_841 [577];
  undefined1 local_600 [680];
  undefined1 local_358 [200];
  undefined1 local_290;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined1 local_24f;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  local_868 = 0x297ac;
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffff4c8,(int *)in_stack_fffffffffffff4c0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff498,in_stack_fffffffffffff490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  local_290 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff4a0);
  local_268 = 0;
  uStack_260 = 0;
  local_258 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff488);
  local_250 = 0;
  local_24f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8,
                 (Type)((ulong)in_stack_fffffffffffff4f0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),
                 in_stack_fffffffffffff4e0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8));
  this_02 = (RPCHelpMan *)(local_889 + 0x1f);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff488);
  __l._M_len._0_7_ = in_stack_fffffffffffff4d8;
  __l._M_array = (iterator)in_stack_fffffffffffff4d0;
  __l._M_len._7_1_ = in_stack_fffffffffffff4df;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff4c8,__l,
             (allocator_type *)in_stack_fffffffffffff4c0);
  name = (string *)local_889;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  description = (string *)&local_88a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  args = &local_8a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  results = (RPCResults *)&local_8aa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  local_8c8._0_8_ = (pointer)0x0;
  local_8c8._8_8_ = 0;
  local_8b8._0_8_ = 0;
  examples = (RPCExamples *)local_8c8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff488);
  RPCResult::RPCResult
            (in_stack_fffffffffffff510,(Type)((ulong)in_stack_fffffffffffff508 >> 0x20),
             &in_stack_fffffffffffff500->m_names,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0
             ,(bool)in_stack_fffffffffffff4ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  local_8e9[1] = (allocator<char>)0x0;
  local_8e9[2] = (allocator<char>)0x0;
  local_8e9[3] = (allocator<char>)0x0;
  local_8e9[4] = (allocator<char>)0x0;
  local_8e9[5] = (allocator<char>)0x0;
  local_8e9[6] = (allocator<char>)0x0;
  local_8e9[7] = (allocator<char>)0x0;
  local_8e9[8] = (allocator<char>)0x0;
  local_8e9[9] = (allocator<char>)0x0;
  local_8e9[10] = (allocator<char>)0x0;
  local_8e9[0xb] = (allocator<char>)0x0;
  local_8e9[0xc] = (allocator<char>)0x0;
  local_8e9[0xd] = (allocator<char>)0x0;
  local_8e9[0xe] = (allocator<char>)0x0;
  local_8e9[0xf] = (allocator<char>)0x0;
  local_8e9[0x10] = (allocator<char>)0x0;
  local_8d8._0_1_ = '\0';
  local_8d8._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff488);
  RPCResult::RPCResult
            (in_stack_fffffffffffff510,(Type)((ulong)in_stack_fffffffffffff508 >> 0x20),
             &in_stack_fffffffffffff500->m_names,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0
             ,(bool)in_stack_fffffffffffff4ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff488);
  RPCResult::RPCResult
            (in_stack_fffffffffffff510,(Type)((ulong)in_stack_fffffffffffff508 >> 0x20),
             &in_stack_fffffffffffff500->m_names,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0
             ,(bool)in_stack_fffffffffffff4ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  local_929[1] = (allocator<char>)0x0;
  local_929[2] = (allocator<char>)0x0;
  local_929[3] = (allocator<char>)0x0;
  local_929[4] = (allocator<char>)0x0;
  local_929[5] = (allocator<char>)0x0;
  local_929[6] = (allocator<char>)0x0;
  local_929[7] = (allocator<char>)0x0;
  local_929[8] = (allocator<char>)0x0;
  local_929[9] = (allocator<char>)0x0;
  local_929[10] = (allocator<char>)0x0;
  local_929[0xb] = (allocator<char>)0x0;
  local_929[0xc] = (allocator<char>)0x0;
  local_929[0xd] = (allocator<char>)0x0;
  local_929[0xe] = (allocator<char>)0x0;
  local_929[0xf] = (allocator<char>)0x0;
  local_929[0x10] = (allocator<char>)0x0;
  local_929[0x11] = (allocator<char>)0x0;
  local_929[0x12] = (allocator<char>)0x0;
  local_929[0x13] = (allocator<char>)0x0;
  local_929[0x14] = (allocator<char>)0x0;
  local_929[0x15] = (allocator<char>)0x0;
  local_929[0x16] = (allocator<char>)0x0;
  local_929[0x17] = (allocator<char>)0x0;
  local_929[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff488);
  this = (vector<RPCResult,_std::allocator<RPCResult>_> *)
         ((ulong)in_stack_fffffffffffff488 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff508,(Type)((ulong)in_stack_fffffffffffff500 >> 0x20),
             in_stack_fffffffffffff4f8,SUB81((ulong)in_stack_fffffffffffff4f0 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4e0,
             (bool)in_stack_fffffffffffff4df);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  local_948 = (pointer)0x0;
  pRStack_940 = (pointer)0x0;
  local_938 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  this_00 = (allocator<RPCResult> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff508,(Type)((ulong)in_stack_fffffffffffff500 >> 0x20),
             in_stack_fffffffffffff4f8,SUB81((ulong)in_stack_fffffffffffff4f0 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffff4ef,in_stack_fffffffffffff4e8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4e0,
             (bool)in_stack_fffffffffffff4df);
  std::allocator<RPCResult>::allocator(this_00);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff4d8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff4d0;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff4df;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff4c8,__l_00,
             (allocator_type *)in_stack_fffffffffffff4c0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff510,(Type)((ulong)in_stack_fffffffffffff508 >> 0x20),
             &in_stack_fffffffffffff500->m_names,in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0
             ,(bool)in_stack_fffffffffffff4ef);
  RPCResults::RPCResults
            ((RPCResults *)in_stack_fffffffffffff508,(RPCResult *)in_stack_fffffffffffff500);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  HelpExampleCli(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff4df,in_stack_fffffffffffff4d8),in_stack_fffffffffffff4d0
             ,(allocator<char> *)in_stack_fffffffffffff4c8);
  HelpExampleRpc(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
  std::operator+(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8);
  RPCExamples::RPCExamples((RPCExamples *)this_00,(string *)0x9e828a);
  this_01 = (RPCArg *)&stack0xfffffffffffff690;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::upgradewallet()::__0,void>
            (in_stack_fffffffffffff498,(anon_class_1_0_00000001 *)in_stack_fffffffffffff490);
  RPCHelpMan::RPCHelpMan
            (this_02,name,description,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff6f0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_01);
  RPCExamples::~RPCExamples((RPCExamples *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_94d);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_94c);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_94b);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_94a);
  RPCResults::~RPCResults((RPCResults *)this_01);
  RPCResult::~RPCResult((RPCResult *)this_01);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff498);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  puVar2 = local_600;
  local_ae8 = local_358;
  do {
    local_ae8 = local_ae8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_ae8 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff498);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_92a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_929);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff498);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff6f6);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff6f7);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff498);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_8ea);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_8e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff498);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_8ca);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_8c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff498);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_8aa);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_88a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_889);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff498);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  puVar2 = local_150;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_869);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  UniValue::~UniValue((UniValue *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_861);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_842);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_841);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan upgradewallet()
{
    return RPCHelpMan{"upgradewallet",
        "\nUpgrade the wallet. Upgrades to the latest version if no version number is specified.\n"
        "New keys may be generated and a new wallet backup will need to be made.",
        {
            {"version", RPCArg::Type::NUM, RPCArg::Default{int{FEATURE_LATEST}}, "The version number to upgrade to. Default is the latest wallet version."}
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "wallet_name", "Name of wallet this operation was performed on"},
                {RPCResult::Type::NUM, "previous_version", "Version of wallet before this operation"},
                {RPCResult::Type::NUM, "current_version", "Version of wallet after this operation"},
                {RPCResult::Type::STR, "result", /*optional=*/true, "Description of result, if no error"},
                {RPCResult::Type::STR, "error", /*optional=*/true, "Error message (if there is one)"}
            },
        },
        RPCExamples{
            HelpExampleCli("upgradewallet", "169900")
            + HelpExampleRpc("upgradewallet", "169900")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    EnsureWalletIsUnlocked(*pwallet);

    int version = 0;
    if (!request.params[0].isNull()) {
        version = request.params[0].getInt<int>();
    }
    bilingual_str error;
    const int previous_version{pwallet->GetVersion()};
    const bool wallet_upgraded{pwallet->UpgradeWallet(version, error)};
    const int current_version{pwallet->GetVersion()};
    std::string result;

    if (wallet_upgraded) {
        if (previous_version == current_version) {
            result = "Already at latest version. Wallet version unchanged.";
        } else {
            result = strprintf("Wallet upgraded successfully from version %i to version %i.", previous_version, current_version);
        }
    }

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("wallet_name", pwallet->GetName());
    obj.pushKV("previous_version", previous_version);
    obj.pushKV("current_version", current_version);
    if (!result.empty()) {
        obj.pushKV("result", result);
    } else {
        CHECK_NONFATAL(!error.empty());
        obj.pushKV("error", error.original);
    }
    return obj;
},
    };
}